

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  stbi__uint32 sVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  int iVar15;
  
  if (j->spec_end != 0) {
    *(char **)(in_FS_OFFSET + -0x20) = "Corrupt JPEG";
    return 0;
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->succ_high != 0) {
    if (j->code_bits < 1) {
      stbi__grow_buffer_unsafe(j);
    }
    if (j->code_bits < 1) {
      return 1;
    }
    sVar1 = j->code_buffer;
    j->code_buffer = sVar1 * 2;
    j->code_bits = j->code_bits + -1;
    if (-1 < (int)sVar1) {
      return 1;
    }
    *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
    return 1;
  }
  data[0x38] = 0;
  data[0x39] = 0;
  data[0x3a] = 0;
  data[0x3b] = 0;
  data[0x3c] = 0;
  data[0x3d] = 0;
  data[0x3e] = 0;
  data[0x3f] = 0;
  data[0x30] = 0;
  data[0x31] = 0;
  data[0x32] = 0;
  data[0x33] = 0;
  data[0x34] = 0;
  data[0x35] = 0;
  data[0x36] = 0;
  data[0x37] = 0;
  data[0x28] = 0;
  data[0x29] = 0;
  data[0x2a] = 0;
  data[0x2b] = 0;
  data[0x2c] = 0;
  data[0x2d] = 0;
  data[0x2e] = 0;
  data[0x2f] = 0;
  data[0x20] = 0;
  data[0x21] = 0;
  data[0x22] = 0;
  data[0x23] = 0;
  data[0x24] = 0;
  data[0x25] = 0;
  data[0x26] = 0;
  data[0x27] = 0;
  data[0x18] = 0;
  data[0x19] = 0;
  data[0x1a] = 0;
  data[0x1b] = 0;
  data[0x1c] = 0;
  data[0x1d] = 0;
  data[0x1e] = 0;
  data[0x1f] = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  data[0x12] = 0;
  data[0x13] = 0;
  data[0x14] = 0;
  data[0x15] = 0;
  data[0x16] = 0;
  data[0x17] = 0;
  data[8] = 0;
  data[9] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar14 = j->code_buffer;
  uVar5 = (ulong)hdc->fast[uVar14 >> 0x17];
  if (uVar5 == 0xff) {
    lVar10 = 0;
    do {
      lVar9 = lVar10;
      lVar10 = lVar9 + 1;
    } while (hdc->maxcode[lVar9 + 10] <= uVar14 >> 0x10);
    iVar15 = j->code_bits;
    if (lVar10 == 8) {
      j->code_bits = iVar15 + -0x10;
      uVar13 = 0xffffffff;
    }
    else {
      uVar13 = 0xffffffff;
      if (((int)(lVar9 + 10) <= iVar15) &&
         (uVar11 = (uVar14 >> (0x17U - (char)lVar10 & 0x1f) & stbi__bmask[lVar9 + 10]) +
                   hdc->delta[lVar9 + 10], uVar11 < 0x100)) {
        j->code_bits = (iVar15 - (int)lVar10) + -9;
        j->code_buffer = uVar14 << ((byte)(lVar9 + 10) & 0x1f);
        uVar5 = (ulong)uVar11;
        goto LAB_001700f7;
      }
    }
  }
  else {
    bVar6 = hdc->size[uVar5];
    uVar13 = 0xffffffff;
    if ((int)(uint)bVar6 <= j->code_bits) {
      j->code_buffer = uVar14 << (bVar6 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar6;
LAB_001700f7:
      uVar13 = (uint)hdc->values[uVar5];
    }
  }
  if (uVar13 < 0x10) {
    uVar14 = 0;
    if (uVar13 != 0) {
      if (j->code_bits < (int)uVar13) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar14 = 0;
      if ((int)uVar13 <= j->code_bits) {
        uVar14 = j->code_buffer;
        bVar6 = (byte)uVar13 & 0x1f;
        uVar4 = uVar14 << bVar6 | uVar14 >> 0x20 - bVar6;
        uVar11 = stbi__bmask[uVar13];
        j->code_buffer = ~uVar11 & uVar4;
        j->code_bits = j->code_bits - uVar13;
        iVar15 = 0;
        if (-1 < (int)uVar14) {
          iVar15 = stbi__jbias[uVar13];
        }
        uVar14 = iVar15 + (uVar4 & uVar11);
      }
    }
    uVar13 = j->img_comp[b].dc_pred;
    if (-1 < (int)(uVar13 ^ uVar14)) {
      bVar2 = (int)uVar13 <= (int)(uVar14 ^ 0x7fffffff);
      if ((int)(uVar13 & uVar14) < 0) {
        bVar2 = (int)(-0x80000000 - uVar14) <= (int)uVar13;
      }
      if (!bVar2) goto LAB_001702aa;
    }
    iVar8 = uVar13 + uVar14;
    j->img_comp[b].dc_pred = iVar8;
    bVar6 = (byte)j->succ_low;
    iVar15 = 1;
    uVar3 = (ushort)(1 << (bVar6 & 0x1f));
    if (1 < (ushort)(uVar3 + 1)) {
      iVar12 = (0x10000 << (bVar6 & 0x1f)) >> 0x10;
      uVar7 = (ushort)iVar8;
      if ((short)(uVar7 ^ uVar3) < 0) {
        iVar12 = -0x8000 / iVar12;
        if ((short)uVar3 < 0) goto LAB_00170299;
        bVar2 = iVar12 <= (short)uVar7;
      }
      else {
        iVar12 = (int)(0x7fff / (long)iVar12);
LAB_00170299:
        bVar2 = (short)uVar7 <= iVar12;
      }
      if (!bVar2) goto LAB_001702aa;
    }
    *data = (short)(iVar8 << (bVar6 & 0x1f));
  }
  else {
LAB_001702aa:
    *(char **)(in_FS_OFFSET + -0x20) = "Corrupt JPEG";
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta", "Corrupt JPEG");
      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      if (!stbi__mul2shorts_valid(dc, 1 << j->succ_low)) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}